

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O0

void __thiscall
PushPopTest_LifoOrder_Test::PushPopTest_LifoOrder_Test(PushPopTest_LifoOrder_Test *this)

{
  undefined8 *in_RDI;
  
  PushPopTest::PushPopTest(&this->super_PushPopTest);
  *in_RDI = &PTR__PushPopTest_LifoOrder_Test_001ce678;
  in_RDI[2] = &PTR__PushPopTest_LifoOrder_Test_001ce6b8;
  return;
}

Assistant:

TEST_P(PushPopTest, LifoOrder) {
    std::size_t n = GetParam();

    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        stdDeque.push_back(x);
    }

    ASSERT_EQ(myDeque.size(), stdDeque.size());

    while (!stdDeque.empty()) {
        int s = stdDeque.back();
        int m = myDeque.back();
        ASSERT_EQ(s, m);
        stdDeque.pop_back();
        myDeque.pop_back();
    }
}